

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O1

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::ProcessGSOutStreamOperations
          (ConversionStream *this,iterator *Token,String *OutStreamName,char *EntryPoint)

{
  TokenListType *pTVar1;
  _List_node_base *__n;
  int iVar2;
  _List_node_base *p_Var3;
  int iVar4;
  string msg;
  string local_78;
  String local_58;
  ConversionStream *local_38;
  
  local_38 = this;
  if (*(int *)&Token->_M_node[1]._M_next != 0x133) {
    FormatString<char[26],char[36]>
              (&local_78,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Token->Type == TokenType::OpenBrace",(char (*) [36])EntryPoint);
    DebugAssertionFailed
              (local_78._M_dataplus._M_p,"ProcessGSOutStreamOperations",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0xff6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
  }
  pTVar1 = &local_38->m_Tokens;
  p_Var3 = Token->_M_node->_M_next;
  Token->_M_node = p_Var3;
  if (p_Var3 != (_List_node_base *)pTVar1) {
    iVar4 = 1;
    do {
      iVar2 = *(int *)&p_Var3[1]._M_next;
      if (iVar2 == 0x134) {
        iVar4 = iVar4 + -1;
        if (iVar4 == 0) {
          return;
        }
      }
      else if (iVar2 == 0x133) {
        iVar4 = iVar4 + 1;
      }
      if (((iVar2 == 0x13b) &&
          (__n = p_Var3[2]._M_next, __n == (_List_node_base *)OutStreamName->_M_string_length)) &&
         ((__n == (_List_node_base *)0x0 ||
          (iVar2 = bcmp(p_Var3[1]._M_prev,(OutStreamName->_M_dataplus)._M_p,(size_t)__n), iVar2 == 0
          )))) {
        p_Var3 = p_Var3->_M_next;
        Token->_M_node = p_Var3;
        if (p_Var3 == (_List_node_base *)pTVar1) {
          FormatString<char[15]>(&local_78,(char (*) [15])"Unexpected EOF");
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    (&local_58,local_38,Token,4);
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ProcessGSOutStreamOperations",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x100c,&local_78,(char (*) [2])0x33bd33,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
        }
        iVar2 = std::__cxx11::string::compare((char *)&Token->_M_node[1]._M_prev);
        if (iVar2 != 0) {
          FormatString<char[13]>(&local_78,(char (*) [13])"\'.\' expected");
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    (&local_58,local_38,Token,4);
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ProcessGSOutStreamOperations",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x100d,&local_78,(char (*) [2])0x33bd33,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::_M_replace
                  ((ulong)&Token->_M_node[1]._M_prev,0,(char *)Token->_M_node[2]._M_next,0x3674c8);
        p_Var3 = Token->_M_node;
        p_Var3[4]._M_next = (_List_node_base *)0x0;
        *(undefined1 *)&(p_Var3[3]._M_prev)->_M_next = 0;
        p_Var3 = Token->_M_node->_M_next;
        Token->_M_node = p_Var3;
        if (p_Var3 == (_List_node_base *)pTVar1) {
          FormatString<char[15]>(&local_78,(char (*) [15])"Unexpected EOF");
          PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    (&local_58,local_38,Token,4);
          LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
                    (false,"ProcessGSOutStreamOperations",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                     ,0x1015,&local_78,(char (*) [2])0x33bd33,&local_58);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
        }
        p_Var3 = Token->_M_node;
        p_Var3[4]._M_next = (_List_node_base *)0x0;
        *(undefined1 *)&(p_Var3[3]._M_prev)->_M_next = 0;
        p_Var3 = Token->_M_node;
      }
      p_Var3 = p_Var3->_M_next;
      Token->_M_node = p_Var3;
    } while (p_Var3 != (_List_node_base *)pTVar1);
  }
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::ProcessGSOutStreamOperations(TokenListType::iterator& Token, const String& OutStreamName, const char* EntryPoint)
{
    VERIFY_EXPR(Token->Type == TokenType::OpenBrace);

    ++Token; // Skip open brace
    int BraceCount = 1;
    // Find matching closing brace
    while (Token != m_Tokens.end())
    {
        if (Token->Type == TokenType::OpenBrace)
            ++BraceCount;
        else if (Token->Type == TokenType::ClosingBrace)
        {
            --BraceCount;
            if (BraceCount == 0)
                break;
        }
        if (Token->Type == TokenType::Identifier && Token->Literal == OutStreamName)
        {
            // triStream.Append( Out );
            // ^
            ++Token;
            // triStream.Append( Out );
            //          ^
            VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF");
            VERIFY_PARSER_STATE(Token, Token->Literal == ".", "\'.\' expected");
            Token->Literal = "_";
            Token->Delimiter.clear();
            // triStream_Append( Out );
            //          ^
            ++Token;
            // triStream_Append( Out );
            //           ^
            VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Unexpected EOF");
            Token->Delimiter.clear();
            ++Token;
        }
        else
            ++Token;
    }
}